

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O2

void usage(void)

{
  fprintf(_stderr,"Usage: %s [CMM source] [OUTPUT ir]\n",_program_invocation_name);
  exit(1);
}

Assistant:

void usage() {
    extern char *program_invocation_name;
#if COMPILER_VERSION >= 4
    fprintf(stderr, "Usage: %s [CMM source] [OUTPUT asm]\n", program_invocation_name);
#elif COMPILER_VERSION >= 3
    fprintf(stderr, "Usage: %s [CMM source] [OUTPUT ir]\n", program_invocation_name);
#else
    fprintf(stderr, "Usage: %s [CMM source]\n", program_invocation_name);
#endif
    exit(EXIT_FAILURE);
}